

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawListSharedData::SetCircleTessellationMaxError(ImDrawListSharedData *this,float max_error)

{
  ImU8 IVar1;
  int iVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  
  if ((this->CircleSegmentMaxError == max_error) &&
     (!NAN(this->CircleSegmentMaxError) && !NAN(max_error))) {
    return;
  }
  if (max_error <= 0.0) {
    __assert_fail("max_error > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                  ,0x187,"void ImDrawListSharedData::SetCircleTessellationMaxError(float)");
  }
  this->CircleSegmentMaxError = max_error;
  lVar3 = 0;
  do {
    IVar1 = '0';
    if (lVar3 != 0) {
      if (lVar3 == 0x40) {
        this->ArcFastRadiusCutoff = this->CircleSegmentMaxError / 0.0021410584;
        return;
      }
      fVar4 = (float)(int)lVar3;
      fVar5 = this->CircleSegmentMaxError;
      if (fVar4 <= this->CircleSegmentMaxError) {
        fVar5 = fVar4;
      }
      fVar5 = acosf(1.0 - fVar5 / fVar4);
      fVar5 = ceilf(3.1415927 / fVar5);
      iVar2 = (((int)fVar5 + 1) / 2) * 2;
      if (0x1ff < iVar2) {
        iVar2 = 0x200;
      }
      IVar1 = (ImU8)iVar2;
      if (iVar2 < 5) {
        IVar1 = '\x04';
      }
    }
    this->CircleSegmentCounts[lVar3] = IVar1;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void ImDrawListSharedData::SetCircleTessellationMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;

    IM_ASSERT(max_error > 0.0f);
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = (float)i;
        CircleSegmentCounts[i] = (ImU8)((i > 0) ? IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError) : IM_DRAWLIST_ARCFAST_SAMPLE_MAX);
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}